

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_scandir_empty_dir(void)

{
  int iVar1;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  void *eval_b_2;
  void *eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_1e8 [4];
  int r;
  uv_dirent_t dent;
  uv_fs_t req;
  char *path;
  
  loop = (uv_loop_t *)uv_default_loop();
  uv_fs_mkdir(0,&dent.type,"./empty_dir/",0x1ff);
  uv_fs_req_cleanup(&dent.type);
  memset(&dent.type,0xdb,0x1c0);
  iVar1 = uv_fs_scandir(0,&dent.type,"./empty_dir/",0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0xc78,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0xc79,"req.result","==","0",req.cb,"==",0);
    abort();
  }
  if (req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0xc7a,"req.ptr","==","NULL",req.result,"==",0);
    abort();
  }
  iVar1 = uv_fs_scandir_next(&dent.type,local_1e8);
  if ((long)iVar1 != -0xfff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0xc7b,"UV_EOF","==","uv_fs_scandir_next(&req, &dent)",0xfffffffffffff001,"==",
            (long)iVar1);
    abort();
  }
  uv_fs_req_cleanup(&dent.type);
  iVar1 = uv_fs_scandir(loop,&scandir_req,"./empty_dir/",0,empty_scandir_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0xc7f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)scandir_cb_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0xc81,"scandir_cb_count","==","0",(long)scandir_cb_count,"==",0);
    abort();
  }
  uv_run(loop,0);
  if ((long)scandir_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0xc83,"1","==","scandir_cb_count",1,"==",(long)scandir_cb_count);
    abort();
  }
  uv_fs_rmdir(0,&dent.type,"./empty_dir/");
  uv_fs_req_cleanup(&dent.type);
  close_loop(loop);
  iVar1 = uv_loop_close(loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
            ,0xc88,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_scandir_empty_dir) {
  const char* path;
  uv_fs_t req;
  uv_dirent_t dent;
  int r;

  path = "./empty_dir/";
  loop = uv_default_loop();

  uv_fs_mkdir(NULL, &req, path, 0777, NULL);
  uv_fs_req_cleanup(&req);

  /* Fill the req to ensure that required fields are cleaned up */
  memset(&req, 0xdb, sizeof(req));

  r = uv_fs_scandir(NULL, &req, path, 0, NULL);
  ASSERT_OK(r);
  ASSERT_OK(req.result);
  ASSERT_NULL(req.ptr);
  ASSERT_EQ(UV_EOF, uv_fs_scandir_next(&req, &dent));
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, empty_scandir_cb);
  ASSERT_OK(r);

  ASSERT_OK(scandir_cb_count);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, scandir_cb_count);

  uv_fs_rmdir(NULL, &req, path, NULL);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}